

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResultModel.cpp
# Opt level: O0

QSize __thiscall ResultModel::span(ResultModel *this,QModelIndex *index)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  const_reference pDVar4;
  const_reference s1;
  const_reference s2;
  bool local_49;
  QModelIndex local_40;
  int local_28;
  int local_24;
  int column;
  int row;
  QModelIndex *index_local;
  ResultModel *this_local;
  
  _column = index;
  index_local = (QModelIndex *)this;
  bVar2 = QModelIndex::isValid(index);
  if (bVar2) {
    local_24 = QModelIndex::row(_column);
    local_28 = QModelIndex::column(_column);
    if ((local_28 == 1) &&
       (pDVar4 = QList<ResultModel::Data>::operator[](&this->m_data,(long)local_24),
       (pDVar4->merged & 1U) != 0)) {
      QSize::QSize((QSize *)&this_local,2,1);
      return (QSize)this_local;
    }
    iVar1 = local_24;
    QModelIndex::QModelIndex(&local_40);
    iVar3 = (**(code **)(*(long *)this + 0x78))(this,&local_40);
    local_49 = false;
    if (iVar1 < iVar3 + -1) {
      pDVar4 = QList<ResultModel::Data>::operator[](&this->m_data,(long)local_24);
      s1 = QList<QString>::at(&pDVar4->list,(long)local_28);
      pDVar4 = QList<ResultModel::Data>::operator[](&this->m_data,(long)(local_24 + 1));
      s2 = QList<QString>::at(&pDVar4->list,(long)local_28);
      local_49 = operator==(s1,s2);
    }
    if (local_49 == false) {
      QSize::QSize((QSize *)&this_local);
    }
    else {
      QSize::QSize((QSize *)&this_local,1,2);
    }
  }
  else {
    QSize::QSize((QSize *)&this_local);
  }
  return (QSize)this_local;
}

Assistant:

QSize ResultModel::span(const QModelIndex &index) const
{
    if (!index.isValid())
        return QSize();

    const int row = index.row();
    const int column = index.column();

    if (column == 1 && m_data[row].merged)
        return QSize(2, 1);

    if (row < rowCount() - 1 && m_data[row].list.at(column) == m_data[row + 1].list.at(column))
        return QSize(1, 2);

    return QSize();
}